

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.cpp
# Opt level: O1

void * ArduinoPressureSensorThread(void *pParam)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  double *pdVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  CHRONO chrono_filter;
  CHRONO chrono_period;
  ARDUINOPRESSURESENSORDATA arduinopressuresensordata;
  char szTemp [256];
  ARDUINOPRESSURESENSOR arduinopressuresensor;
  char szSaveFilePath [256];
  interval local_8d8;
  int local_8c0;
  int local_8bc;
  timespec local_8b8;
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double dStack_890;
  timespec local_888;
  int local_878;
  timespec local_870;
  double local_860;
  double dStack_858;
  double local_850;
  double dStack_848;
  timespec local_840;
  int local_830;
  undefined1 local_828 [16];
  double local_818;
  double local_810;
  ARDUINOPRESSURESENSORDATA local_808;
  interval local_7d8;
  interval local_7c0;
  char local_7a8 [264];
  ARDUINOPRESSURESENSOR local_6a0;
  char local_138 [264];
  
  memset(&local_6a0,0,0x568);
  iVar4 = clock_getres(4,&local_888);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_8b8), iVar4 == 0)) {
    local_878 = 0;
    local_8a8 = 0.0;
    dStack_8a0 = 0.0;
    local_898 = 0.0;
    dStack_890 = 0.0;
  }
  iVar4 = clock_getres(4,&local_840);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_870), iVar4 == 0)) {
    local_830 = 0;
    local_860 = 0.0;
    dStack_858 = 0.0;
    local_850 = 0.0;
    dStack_848 = 0.0;
  }
  iVar4 = 0x32;
  local_828 = ZEXT816(0);
  bVar2 = false;
  local_8c0 = 0;
  do {
    local_8bc = iVar4;
    while( true ) {
      if (local_830 == 0) {
        clock_gettime(4,(timespec *)&local_8d8);
        local_860 = local_8d8.inf;
        dStack_858 = local_8d8.sup;
        local_8d8.inf =
             (double)(((long)local_8d8.inf + (long)local_850 +
                      ((long)local_8d8.sup + (long)dStack_848) / 1000000000) - local_870.tv_sec);
        local_8d8.sup =
             (double)(((long)local_8d8.sup + (long)dStack_848) % 1000000000 - local_870.tv_nsec);
        if ((long)local_8d8.sup < 0) {
          local_8d8.inf = (double)((long)local_8d8.inf + (long)local_8d8.sup / 1000000000 + -1);
          local_8d8.sup = (double)((long)local_8d8.sup % 1000000000 + 1000000000);
        }
        local_850 = local_8d8.inf;
        dStack_848 = local_8d8.sup;
      }
      iVar5 = clock_getres(4,&local_840);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_870), iVar5 == 0)) {
        local_830 = 0;
        local_850 = 0.0;
        dStack_848 = 0.0;
        local_860 = 0.0;
        dStack_858 = 0.0;
      }
      local_8d8.inf = (double)((long)iVar4 / 1000);
      local_8d8.sup = (double)(((long)iVar4 % 1000) * 1000000);
      nanosleep((timespec *)&local_8d8,(timespec *)0x0);
      iVar5 = local_8bc;
      if (bPauseArduinoPressureSensor == 0) break;
      if (bVar2) {
        puts("ArduinoPressureSensor paused.");
        iVar5 = CloseRS232Port(&local_6a0.RS232Port);
        pcVar15 = "ArduinoPressureSensor disconnection failed.";
        if (iVar5 == 0) {
          pcVar15 = "ArduinoPressureSensor disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit != 0) {
        bVar3 = true;
        goto LAB_001bb314;
      }
      local_8d8.inf = 0.0;
      local_8d8.sup = 4.94065645841247e-316;
      bVar2 = false;
      nanosleep((timespec *)&local_8d8,(timespec *)0x0);
    }
    if (bRestartArduinoPressureSensor != 0) {
      if (bVar2) {
        puts("Restarting an ArduinoPressureSensor.");
        iVar4 = CloseRS232Port(&local_6a0.RS232Port);
        pcVar15 = "ArduinoPressureSensor disconnection failed.";
        if (iVar4 == 0) {
          pcVar15 = "ArduinoPressureSensor disconnected.";
        }
        puts(pcVar15);
      }
      bRestartArduinoPressureSensor = 0;
      bVar2 = false;
    }
    if (bVar2) {
      iVar4 = GetLatestDataArduinoPressureSensor(&local_6a0,&local_808);
      if (iVar4 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pressure_mes = local_808.Pressure;
        if (local_878 == 0) {
          clock_gettime(4,(timespec *)&local_8d8);
          local_8d8.inf =
               (double)(((long)local_8d8.inf + (long)local_898 +
                        ((long)local_8d8.sup + (long)dStack_890) / 1000000000) - local_8b8.tv_sec);
          local_8d8.sup =
               (double)(((long)local_8d8.sup + (long)dStack_890) % 1000000000 - local_8b8.tv_nsec);
          if ((long)local_8d8.sup < 0) {
            local_8d8.inf = (double)((long)local_8d8.inf + (long)local_8d8.sup / 1000000000 + -1);
            local_8d8.sup = (double)((long)local_8d8.sup % 1000000000 + 1000000000);
          }
          pdVar12 = &local_8d8.sup;
          dVar8 = local_8d8.inf;
        }
        else {
          pdVar12 = &dStack_890;
          dVar8 = local_898;
        }
        if (2.0 < (double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8) {
          if (local_878 == 0) {
            clock_gettime(4,(timespec *)&local_8d8);
            local_8d8.inf =
                 (double)(((long)local_8d8.inf + (long)local_898 +
                          ((long)local_8d8.sup + (long)dStack_890) / 1000000000) - local_8b8.tv_sec)
            ;
            local_8d8.sup =
                 (double)(((long)local_8d8.sup + (long)dStack_890) % 1000000000 - local_8b8.tv_nsec)
            ;
            if ((long)local_8d8.sup < 0) {
              local_8d8.inf = (double)((long)local_8d8.inf + (long)local_8d8.sup / 1000000000 + -1);
              local_8d8.sup = (double)((long)local_8d8.sup % 1000000000 + 1000000000);
            }
            pdVar12 = &local_8d8.sup;
            dVar8 = local_8d8.inf;
          }
          else {
            pdVar12 = &dStack_890;
            dVar8 = local_898;
          }
          if ((double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8 <= 3.0) {
            local_828._8_8_ = 0;
            local_828._0_8_ = local_808.Pressure;
          }
        }
        if (local_878 == 0) {
          clock_gettime(4,(timespec *)&local_8d8);
          local_8d8.inf =
               (double)(((long)local_8d8.inf + (long)local_898 +
                        ((long)local_8d8.sup + (long)dStack_890) / 1000000000) - local_8b8.tv_sec);
          local_8d8.sup =
               (double)(((long)local_8d8.sup + (long)dStack_890) % 1000000000 - local_8b8.tv_nsec);
          if ((long)local_8d8.sup < 0) {
            local_8d8.inf = (double)((long)local_8d8.inf + (long)local_8d8.sup / 1000000000 + -1);
            local_8d8.sup = (double)((long)local_8d8.sup % 1000000000 + 1000000000);
          }
          pdVar12 = &local_8d8.sup;
          dVar8 = local_8d8.inf;
        }
        else {
          pdVar12 = &dStack_890;
          dVar8 = local_898;
        }
        dVar17 = local_808.Pressure;
        if (3.0 < (double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8) {
          uVar16 = -(ulong)(ABS(local_808.Pressure - local_828._0_8_) < 0.05);
          auVar18._0_8_ = (ulong)local_808.Pressure & uVar16;
          auVar18._8_8_ = 0;
          auVar1._8_4_ = local_828._8_4_;
          auVar1._0_8_ = ~uVar16 & (ulong)local_828._0_8_;
          auVar1._12_4_ = local_828._12_4_;
          local_828 = auVar18 | auVar1;
          dVar17 = local_828._0_8_;
        }
        local_810 = ((dVar17 - local_6a0.PressureRef) * -100000.0) /
                    (local_6a0.WaterDensity * 9.80665);
        interval::interval(&local_7c0,&local_810);
        local_818 = -z_pressure_acc;
        interval::interval(&local_7d8,&local_818,&z_pressure_acc);
        operator+(&local_7c0,&local_7d8);
        interval::operator=((interval *)&z_pressure,&local_8d8);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar2 = true;
        bVar3 = false;
        iVar4 = iVar5;
      }
      else {
        puts("Connection to an ArduinoPressureSensor lost.");
        iVar4 = CloseRS232Port(&local_6a0.RS232Port);
        if (iVar4 == 0) {
          pcVar15 = "ArduinoPressureSensor disconnected.";
        }
        else {
          pcVar15 = "ArduinoPressureSensor disconnection failed.";
        }
        puts(pcVar15);
LAB_001bac8f:
        bVar2 = false;
        bVar3 = true;
        iVar4 = iVar5;
      }
    }
    else {
      iVar6 = ConnectArduinoPressureSensor(&local_6a0,"ArduinoPressureSensor0.txt");
      iVar4 = local_6a0.threadperiod;
      if (iVar6 != 0) {
        local_8d8.inf = 4.94065645841247e-324;
        local_8d8.sup = 0.0;
        nanosleep((timespec *)&local_8d8,(timespec *)0x0);
        goto LAB_001bac8f;
      }
      local_808.pressure = 0.0;
      local_808.temperature = 0.0;
      local_808.depth = 0.0;
      local_808.altitude = 0.0;
      local_808.Pressure = 0.0;
      if (local_878 == 0) {
        clock_gettime(4,(timespec *)&local_8d8);
        local_8a8 = local_8d8.inf;
        dStack_8a0 = local_8d8.sup;
        local_8d8.inf =
             (double)(((long)local_8d8.inf + (long)local_898 +
                      ((long)local_8d8.sup + (long)dStack_890) / 1000000000) - local_8b8.tv_sec);
        local_8d8.sup =
             (double)(((long)local_8d8.sup + (long)dStack_890) % 1000000000 - local_8b8.tv_nsec);
        if ((long)local_8d8.sup < 0) {
          local_8d8.inf = (double)((long)local_8d8.inf + (long)local_8d8.sup / 1000000000 + -1);
          local_8d8.sup = (double)((long)local_8d8.sup % 1000000000 + 1000000000);
        }
        local_898 = local_8d8.inf;
        dStack_890 = local_8d8.sup;
      }
      iVar5 = clock_getres(4,&local_888);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_8b8), iVar5 == 0)) {
        local_878 = 0;
        local_898 = 0.0;
        dStack_890 = 0.0;
        local_8a8 = 0.0;
        dStack_8a0 = 0.0;
      }
      if ((FILE *)local_6a0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_6a0.pfSaveFile);
        local_6a0.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = false;
      bVar2 = true;
      if ((local_6a0.bSaveRawData != 0) && ((FILE *)local_6a0.pfSaveFile == (FILE *)0x0)) {
        if (local_6a0.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_7a8,"arduinopressuresensor",0x16);
        }
        else {
          sprintf(local_7a8,"%.127s",local_6a0.szCfgFilePath);
        }
        sVar9 = strlen(local_7a8);
        uVar7 = (uint)sVar9;
        uVar14 = sVar9 & 0xffffffff;
        uVar10 = (int)uVar7 >> 0x1f & uVar7;
        uVar16 = sVar9 & 0xffffffff;
        do {
          uVar14 = uVar14 - 1;
          uVar13 = (uint)uVar16;
          uVar16 = (ulong)(uVar10 - 1);
          uVar11 = uVar10;
          if ((int)uVar13 < 1) break;
          uVar16 = (ulong)(uVar13 - 1);
          uVar11 = uVar13;
        } while (local_7a8[uVar14 & 0xffffffff] != '.');
        if ((int)uVar11 <= (int)uVar7 && 1 < (int)uVar11) {
          memset(local_7a8 + uVar16,0,sVar9 - uVar16);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar15 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.txt",local_7a8,pcVar15);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        bVar3 = false;
        local_6a0.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_6a0.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create ArduinoPressureSensor data file.");
          bVar3 = false;
          goto LAB_001bb314;
        }
      }
    }
    if ((bVar3) &&
       (local_8c0 = local_8c0 + 1, ExitOnErrorCount <= local_8c0 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001bb314:
      if (local_830 == 0) {
        clock_gettime(4,(timespec *)&local_8d8);
        local_860 = local_8d8.inf;
        dStack_858 = local_8d8.sup;
        local_8d8.inf =
             (double)(((long)local_8d8.inf + (long)local_850 +
                      ((long)local_8d8.sup + (long)dStack_848) / 1000000000) - local_870.tv_sec);
        local_8d8.sup =
             (double)(((long)local_8d8.sup + (long)dStack_848) % 1000000000 - local_870.tv_nsec);
        if ((long)local_8d8.sup < 0) {
          local_8d8.inf = (double)((long)local_8d8.inf + (long)local_8d8.sup / 1000000000 + -1);
          local_8d8.sup = (double)((long)local_8d8.sup % 1000000000 + 1000000000);
        }
        local_850 = local_8d8.inf;
        dStack_848 = local_8d8.sup;
      }
      if (local_878 == 0) {
        clock_gettime(4,(timespec *)&local_8d8);
        local_8a8 = local_8d8.inf;
        dStack_8a0 = local_8d8.sup;
        local_8d8.inf =
             (double)(((long)local_8d8.inf + (long)local_898 +
                      ((long)local_8d8.sup + (long)dStack_890) / 1000000000) - local_8b8.tv_sec);
        local_8d8.sup =
             (double)(((long)local_8d8.sup + (long)dStack_890) % 1000000000 - local_8b8.tv_nsec);
        if ((long)local_8d8.sup < 0) {
          local_8d8.inf = (double)((long)local_8d8.inf + (long)local_8d8.sup / 1000000000 + -1);
          local_8d8.sup = (double)((long)local_8d8.sup % 1000000000 + 1000000000);
        }
        local_898 = local_8d8.inf;
        dStack_890 = local_8d8.sup;
      }
      if ((FILE *)local_6a0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_6a0.pfSaveFile);
        local_6a0.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        iVar4 = CloseRS232Port(&local_6a0.RS232Port);
        pcVar15 = "ArduinoPressureSensor disconnection failed.";
        if (iVar4 == 0) {
          pcVar15 = "ArduinoPressureSensor disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE ArduinoPressureSensorThread(void* pParam)
{
	ARDUINOPRESSURESENSOR arduinopressuresensor;
	ARDUINOPRESSURESENSORDATA arduinopressuresensordata;
	double pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&arduinopressuresensor, 0, sizeof(ARDUINOPRESSURESENSOR));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseArduinoPressureSensor) 
		{ 
			if (bConnected)
			{
				printf("ArduinoPressureSensor paused.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartArduinoPressureSensor) 
		{ 
			if (bConnected)
			{
				printf("Restarting an ArduinoPressureSensor.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
			bRestartArduinoPressureSensor = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectArduinoPressureSensor(&arduinopressuresensor, "ArduinoPressureSensor0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = arduinopressuresensor.threadperiod;

				memset(&arduinopressuresensordata, 0, sizeof(arduinopressuresensordata));
				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (arduinopressuresensor.pfSaveFile != NULL)
				{
					fclose(arduinopressuresensor.pfSaveFile); 
					arduinopressuresensor.pfSaveFile = NULL;
				}
				if ((arduinopressuresensor.bSaveRawData)&&(arduinopressuresensor.pfSaveFile == NULL)) 
				{
					if (strlen(arduinopressuresensor.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", arduinopressuresensor.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "arduinopressuresensor");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					arduinopressuresensor.pfSaveFile = fopen(szSaveFilePath, "w");
					if (arduinopressuresensor.pfSaveFile == NULL) 
					{
						printf("Unable to create ArduinoPressureSensor data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataArduinoPressureSensor(&arduinopressuresensor, &arduinopressuresensordata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = arduinopressuresensordata.Pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = arduinopressuresensordata.Pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(arduinopressuresensordata.Pressure-pressure_prev) < 0.05)
					{
						filteredpressure = arduinopressuresensordata.Pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = arduinopressuresensordata.Pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, arduinopressuresensor.PressureRef, arduinopressuresensor.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to an ArduinoPressureSensor lost.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
		}

		//printf("ArduinoPressureSensorThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (arduinopressuresensor.pfSaveFile != NULL)
	{
		fclose(arduinopressuresensor.pfSaveFile); 
		arduinopressuresensor.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectArduinoPressureSensor(&arduinopressuresensor);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}